

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

void tcpkeepalive(Curl_easy *data,curl_socket_t sockfd)

{
  int iVar1;
  uint *puVar2;
  char *fmt;
  int optval;
  uint local_1c;
  
  local_1c = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ba >> 0x27) & 1;
  iVar1 = setsockopt(sockfd,1,9,&local_1c,4);
  if (iVar1 < 0) {
    if (data == (Curl_easy *)0x0) {
      return;
    }
    if (((data->set).field_0x8bd & 0x10) == 0) {
      return;
    }
    fmt = "Failed to set SO_KEEPALIVE on fd %d: errno %d";
  }
  else {
    local_1c = curlx_sltosi((long)(data->set).tcp_keepidle);
    iVar1 = setsockopt(sockfd,6,4,&local_1c,4);
    if (((data != (Curl_easy *)0x0) && (iVar1 < 0)) && (((data->set).field_0x8bd & 0x10) != 0)) {
      puVar2 = (uint *)__errno_location();
      Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d: errno %d",sockfd,(ulong)*puVar2);
    }
    local_1c = curlx_sltosi((long)(data->set).tcp_keepintvl);
    iVar1 = setsockopt(sockfd,6,5,&local_1c,4);
    if (data == (Curl_easy *)0x0) {
      return;
    }
    if (-1 < iVar1) {
      return;
    }
    if (((data->set).field_0x8bd & 0x10) == 0) {
      return;
    }
    fmt = "Failed to set TCP_KEEPINTVL on fd %d: errno %d";
  }
  puVar2 = (uint *)__errno_location();
  Curl_infof(data,fmt,sockfd,(ulong)*puVar2);
  return;
}

Assistant:

static void
tcpkeepalive(struct Curl_easy *data,
             curl_socket_t sockfd)
{
  int optval = data->set.tcp_keepalive?1:0;

  /* only set IDLE and INTVL if setting KEEPALIVE is successful */
  if(setsockopt(sockfd, SOL_SOCKET, SO_KEEPALIVE,
        (void *)&optval, sizeof(optval)) < 0) {
    infof(data, "Failed to set SO_KEEPALIVE on fd "
          "%" CURL_FORMAT_SOCKET_T ": errno %d",
          sockfd, SOCKERRNO);
  }
  else {
#if defined(SIO_KEEPALIVE_VALS)
    struct tcp_keepalive vals;
    DWORD dummy;
    vals.onoff = 1;
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    vals.keepalivetime = optval;
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    vals.keepaliveinterval = optval;
    if(WSAIoctl(sockfd, SIO_KEEPALIVE_VALS, (LPVOID) &vals, sizeof(vals),
                NULL, 0, &dummy, NULL, NULL) != 0) {
      infof(data, "Failed to set SIO_KEEPALIVE_VALS on fd "
                  "%" CURL_FORMAT_SOCKET_T ": errno %d",
                  sockfd, SOCKERRNO);
    }
#else
#ifdef TCP_KEEPIDLE
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPIDLE,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPIDLE on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#elif defined(TCP_KEEPALIVE)
    /* Mac OS X style */
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPALIVE,
      (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPALIVE on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#endif
#ifdef TCP_KEEPINTVL
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPINTVL,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPINTVL on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#endif
#endif
  }
}